

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseConnectDefBoxes(Ver_Man_t *pMan)

{
  int *piVar1;
  Abc_Obj_t **ppAVar2;
  int iVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  void *pvVar5;
  Abc_Ntk_t *pAVar6;
  Abc_Obj_t *__ptr;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Vec_Ptr_t *pVVar11;
  char *pcVar12;
  Abc_Obj_t *pAVar13;
  long lVar14;
  size_t sVar15;
  Abc_Obj_t *pAVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  Abc_Ntk_t *pAVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  Abc_Ntk_t *pAVar29;
  bool bVar30;
  uint local_470;
  uint local_46c;
  char local_418 [1000];
  
  pVVar11 = pMan->pDesign->vModules;
  if (pVVar11->nSize < 1) {
    iVar25 = 1;
  }
  else {
    iVar25 = 1;
    lVar22 = 0;
    do {
      pvVar4 = pVVar11->pArray[lVar22];
      lVar19 = *(long *)((long)pvVar4 + 0x50);
      if (0 < *(int *)(lVar19 + 4)) {
        lVar26 = 0;
        do {
          pObj = *(Abc_Obj_t **)(*(long *)(lVar19 + 8) + lVar26 * 8);
          uVar20 = *(uint *)&pObj->field_0x14 & 0xf;
          if ((uVar20 != 8) && (pvVar5 = (pObj->field_5).pData, pvVar5 != (void *)0x0)) {
            lVar19 = *(long *)((long)pvVar5 + 8);
            if (lVar19 == 0) {
              __assert_fail("pNtkBox->pName",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                            ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
            }
            lVar14 = *(long *)((long)pvVar5 + 0x28);
            iVar18 = *(int *)(lVar14 + 4);
            if ((iVar18 == 0) && (*(int *)(*(long *)((long)pvVar5 + 0x30) + 4) == 0)) {
              iVar25 = 2;
            }
            else {
              if (uVar20 != 10 && (*(uint *)&pObj->field_0x14 & 0xe) != 8) {
                __assert_fail("Abc_ObjIsBox(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                              ,0x4e,"int Ver_ObjIsConnected(Abc_Obj_t *)");
              }
              if (((pObj->vFanins).nSize != 0) || ((pObj->vFanouts).nSize != 0)) {
                __assert_fail("!Ver_ObjIsConnected(pBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                              ,0x821,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              pAVar6 = pObj->pNtk;
              __ptr = (pObj->field_6).pCopy;
              if ((iVar18 == 0) && (*(int *)(*(long *)((long)pvVar5 + 0x30) + 4) == 0)) {
                __assert_fail("Ver_NtkIsDefined(pNtkBox)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                              ,0x822,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              if ((*(int *)((long)pvVar5 + 4) == 6) &&
                 (*(int *)(*(long *)((long)pvVar5 + 0x50) + 4) != 1)) {
                __assert_fail("!Abc_NtkHasBlackbox(pNtkBox) || Abc_NtkBoxNum(pNtkBox) == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                              ,0x823,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
              }
              uVar20 = *(uint *)((long)&__ptr->pNtk + 4);
              uVar27 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4) + iVar18;
              if ((int)uVar27 < (int)uVar20) {
                pcVar12 = Abc_ObjName(pObj);
                sprintf(pMan->sError,
                        "The number of actual IOs (%d) is bigger than the number of formal IOs (%d) when instantiating network %s in box %s."
                        ,(ulong)uVar20,(ulong)uVar27,lVar19,pcVar12);
                if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                  lVar22 = 0;
                  do {
                    Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar22]);
                    lVar22 = lVar22 + 1;
                  } while (lVar22 < *(int *)((long)&__ptr->pNtk + 4));
                }
LAB_0084ebce:
                if (__ptr->pNext != (Abc_Obj_t *)0x0) {
                  free(__ptr->pNext);
                  __ptr->pNext = (Abc_Obj_t *)0x0;
                }
                if (__ptr != (Abc_Obj_t *)0x0) {
                  free(__ptr);
                }
                (pObj->field_6).pTemp = (void *)0x0;
LAB_0084ec3c:
                Ver_ParsePrintErrorMessage(pMan);
                return 0;
              }
              if ((int)uVar20 < 1) {
LAB_0084e531:
                if (0 < iVar18) {
                  uVar24 = 0;
                  do {
                    local_470 = (uint)uVar24;
                    if ((int)local_470 < 0) goto LAB_0084ed1a;
                    plVar8 = *(long **)(*(long *)(lVar14 + 8) + uVar24 * 8);
                    pcVar12 = Abc_ObjName(*(Abc_Obj_t **)
                                           (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                           (long)*(int *)plVar8[6] * 8));
                    uVar20 = *(uint *)((long)&__ptr->pNtk + 4);
                    if ((int)uVar20 < 1) {
                      uVar24 = 0;
                      pAVar29 = (Abc_Ntk_t *)0x0;
                    }
                    else {
                      pAVar16 = __ptr->pNext;
                      uVar24 = 0;
                      do {
                        pAVar29 = (&pAVar16->pNtk)[uVar24];
                        iVar18 = strcmp(*(char **)pAVar29,pcVar12);
                        if (iVar18 == 0) goto LAB_0084e5a9;
                        uVar24 = uVar24 + 1;
                      } while (uVar20 != uVar24);
                      uVar24 = (ulong)uVar20;
                    }
LAB_0084e5a9:
                    if (pAVar29 == (Abc_Ntk_t *)0x0) {
                      __assert_fail("pBundle != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                                    ,0x885,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
                    }
                    if ((uint)uVar24 == uVar20) {
                      sVar15 = strlen(pcVar12);
                      if (pcVar12[(long)((sVar15 << 0x20) + -0x100000000) >> 0x20] == ']') {
                        local_46c = ((int)(uint)sVar15 >> 0x1f & (uint)sVar15) - 1;
                        uVar24 = (sVar15 & 0xffffffff) - 1;
                        do {
                          if ((int)sVar15 < 1) {
                            bVar30 = false;
                            goto LAB_0084e617;
                          }
                          uVar21 = uVar24 & 0xffffffff;
                          uVar24 = uVar24 - 1;
                          uVar27 = (int)sVar15 - 1;
                          sVar15 = (size_t)uVar27;
                        } while (pcVar12[uVar21] != '[');
                        bVar30 = uVar24 != 0xffffffffffffffff;
                        local_46c = uVar27;
LAB_0084e617:
                        if (!bVar30) goto LAB_0084e670;
                        if ((int)uVar20 < 1) {
                          uVar24 = 0;
                          pAVar23 = (Abc_Ntk_t *)0x0;
                        }
                        else {
                          pAVar16 = __ptr->pNext;
                          uVar24 = 0;
                          do {
                            pAVar23 = (&pAVar16->pNtk)[uVar24];
                            pcVar17 = *(char **)pAVar23;
                            iVar18 = strncmp(pcVar17,pcVar12,(ulong)local_46c);
                            if ((iVar18 == 0) &&
                               (sVar15 = strlen(pcVar17), local_46c == (uint)sVar15))
                            goto LAB_0084e67a;
                            uVar24 = uVar24 + 1;
                          } while (uVar20 != uVar24);
                          uVar24 = (ulong)uVar20;
                        }
LAB_0084e67a:
                        pAVar29 = (Abc_Ntk_t *)0x0;
                        if ((uint)uVar24 != uVar20) {
                          pAVar29 = pAVar23;
                        }
                      }
                      else {
LAB_0084e670:
                        pAVar29 = (Abc_Ntk_t *)0x0;
                      }
                      if (pAVar29 == (Abc_Ntk_t *)0x0) {
                        uVar10 = *(undefined8 *)((long)pvVar5 + 8);
                        Abc_ObjName(pObj);
                        sprintf(pMan->sError,
                                "Cannot find an actual net for the formal net %s when instantiating network %s in box %s."
                                ,pcVar12,uVar10);
                        goto LAB_0084ec3c;
                      }
                    }
                    iVar18 = *(int *)(pAVar29->pName + 4);
                    if (0 < (long)iVar18) {
                      local_470 = local_470 + iVar18;
                      lVar19 = (long)iVar18;
                      do {
                        if (*(int *)(pAVar29->pName + 4) < lVar19) goto LAB_0084ed1a;
                        pAVar16 = *(Abc_Obj_t **)(*(long *)(pAVar29->pName + 8) + -8 + lVar19 * 8);
                        pAVar13 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_BI);
                        Abc_ObjAddFanin(pObj,pAVar13);
                        Abc_ObjAddFanin(pAVar13,pAVar16);
                        bVar30 = 1 < lVar19;
                        lVar19 = lVar19 + -1;
                      } while (bVar30);
                    }
                    lVar14 = *(long *)((long)pvVar5 + 0x28);
                    uVar24 = (ulong)local_470;
                  } while ((int)local_470 < *(int *)(lVar14 + 4));
                }
                lVar19 = *(long *)((long)pvVar5 + 0x30);
                if (0 < *(int *)(lVar19 + 4)) {
                  uVar20 = 0;
                  do {
                    if ((int)uVar20 < 0) goto LAB_0084ed1a;
                    plVar8 = *(long **)(*(long *)(lVar19 + 8) + (ulong)uVar20 * 8);
                    pcVar12 = Abc_ObjName(*(Abc_Obj_t **)
                                           (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                           (long)*(int *)plVar8[4] * 8));
                    uVar27 = *(uint *)((long)&__ptr->pNtk + 4);
                    if ((int)uVar27 < 1) {
                      uVar24 = 0;
                      pAVar29 = (Abc_Ntk_t *)0x0;
                    }
                    else {
                      pAVar16 = __ptr->pNext;
                      uVar24 = 0;
                      do {
                        pAVar29 = (&pAVar16->pNtk)[uVar24];
                        iVar18 = strcmp(*(char **)pAVar29,pcVar12);
                        if (iVar18 == 0) goto LAB_0084e791;
                        uVar24 = uVar24 + 1;
                      } while (uVar27 != uVar24);
                      uVar24 = (ulong)uVar27;
                    }
LAB_0084e791:
                    if (pAVar29 == (Abc_Ntk_t *)0x0) {
                      __assert_fail("pBundle != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/ver/verCore.c"
                                    ,0x8b8,"int Ver_ParseConnectBox(Ver_Man_t *, Abc_Obj_t *)");
                    }
                    if ((uint)uVar24 == uVar27) {
                      sVar15 = strlen(pcVar12);
                      if (pcVar12[(long)((sVar15 << 0x20) + -0x100000000) >> 0x20] == ']') {
                        local_46c = ((int)(uint)sVar15 >> 0x1f & (uint)sVar15) - 1;
                        uVar24 = (sVar15 & 0xffffffff) - 1;
                        do {
                          if ((int)sVar15 < 1) {
                            bVar30 = false;
                            goto LAB_0084e804;
                          }
                          uVar21 = uVar24 & 0xffffffff;
                          uVar24 = uVar24 - 1;
                          uVar28 = (int)sVar15 - 1;
                          sVar15 = (size_t)uVar28;
                        } while (pcVar12[uVar21] != '[');
                        bVar30 = uVar24 != 0xffffffffffffffff;
                        local_46c = uVar28;
LAB_0084e804:
                        if (!bVar30) goto LAB_0084e858;
                        if ((int)uVar27 < 1) {
                          uVar24 = 0;
                          pAVar23 = (Abc_Ntk_t *)0x0;
                        }
                        else {
                          pAVar16 = __ptr->pNext;
                          uVar24 = 0;
                          do {
                            pAVar23 = (&pAVar16->pNtk)[uVar24];
                            pcVar17 = *(char **)pAVar23;
                            iVar18 = strncmp(pcVar17,pcVar12,(ulong)local_46c);
                            if ((iVar18 == 0) &&
                               (sVar15 = strlen(pcVar17), local_46c == (uint)sVar15))
                            goto LAB_0084e862;
                            uVar24 = uVar24 + 1;
                          } while (uVar27 != uVar24);
                          uVar24 = (ulong)uVar27;
                        }
LAB_0084e862:
                        pAVar29 = (Abc_Ntk_t *)0x0;
                        if ((uint)uVar24 != uVar27) {
                          pAVar29 = pAVar23;
                        }
                      }
                      else {
LAB_0084e858:
                        pAVar29 = (Abc_Ntk_t *)0x0;
                      }
                      if (pAVar29 != (Abc_Ntk_t *)0x0) goto LAB_0084e882;
                      pAVar16 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_BO);
                      sprintf(local_418,"_temp_net%d",(ulong)(uint)pAVar16->Id);
                      pAVar13 = Abc_NtkFindOrCreateNet(pAVar6,local_418);
                      Abc_ObjAddFanin(pAVar16,pObj);
                      Abc_ObjAddFanin(pAVar13,pAVar16);
                      uVar20 = uVar20 + 1;
                    }
                    else {
LAB_0084e882:
                      iVar18 = *(int *)(pAVar29->pName + 4);
                      if (0 < (long)iVar18) {
                        uVar20 = uVar20 + iVar18;
                        lVar19 = (long)iVar18;
                        do {
                          if (*(int *)(pAVar29->pName + 4) < lVar19) goto LAB_0084ed1a;
                          pAVar16 = *(Abc_Obj_t **)(*(long *)(pAVar29->pName + 8) + -8 + lVar19 * 8)
                          ;
                          pcVar12 = Abc_ObjName(pAVar16);
                          iVar18 = strcmp(pcVar12,"1\'b0");
                          if (iVar18 == 0) {
LAB_0084eb66:
                            uVar10._0_4_ = pAVar29->ntkType;
                            uVar10._4_4_ = pAVar29->ntkFunc;
                            pcVar12 = Abc_ObjName(pAVar16);
                            uVar9 = *(undefined8 *)((long)pvVar5 + 8);
                            pcVar17 = Abc_ObjName(pObj);
                            sprintf(pMan->sError,
                                    "It looks like formal output %s is driving a constant net (%s) when instantiating network %s in box %s."
                                    ,uVar10,pcVar12,uVar9,pcVar17);
                            if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                              lVar22 = 0;
                              do {
                                Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar22]);
                                lVar22 = lVar22 + 1;
                              } while (lVar22 < *(int *)((long)&__ptr->pNtk + 4));
                            }
                            goto LAB_0084ebce;
                          }
                          pcVar12 = Abc_ObjName(pAVar16);
                          iVar18 = strcmp(pcVar12,"1\'b1");
                          if (iVar18 == 0) goto LAB_0084eb66;
                          pAVar13 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_BO);
                          Abc_ObjAddFanin(pAVar13,pObj);
                          Abc_ObjAddFanin(pAVar16,pAVar13);
                          bVar30 = 1 < lVar19;
                          lVar19 = lVar19 + -1;
                        } while (bVar30);
                      }
                    }
                    lVar19 = *(long *)((long)pvVar5 + 0x30);
                  } while ((int)uVar20 < *(int *)(lVar19 + 4));
                }
                if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                  lVar19 = 0;
                  do {
                    Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < *(int *)((long)&__ptr->pNtk + 4));
                }
              }
              else {
                pAVar29 = __ptr->pNext->pNtk;
                lVar7._0_4_ = pAVar29->ntkType;
                lVar7._4_4_ = pAVar29->ntkFunc;
                if (lVar7 != 0) {
                  uVar24 = 0;
                  do {
                    if ((ulong)uVar20 - 1 == uVar24) goto LAB_0084e531;
                    ppAVar2 = &__ptr->pNext->pNext + uVar24;
                    uVar24 = uVar24 + 1;
                  } while ((*ppAVar2)->pNtk != (Abc_Ntk_t *)0x0);
                  if (uVar20 <= uVar24) goto LAB_0084e531;
                }
                pcVar12 = Abc_ObjName(pObj);
                uVar27 = 0;
                printf("Warning: The instance %s of network %s will be connected without using formal names.\n"
                       ,lVar19,pcVar12);
                uVar20 = *(uint *)((long)&__ptr->pNtk + 4);
                if (0 < (long)(int)uVar20) {
                  lVar19 = 0;
                  uVar27 = 0;
                  do {
                    uVar27 = uVar27 + *(int *)((&__ptr->pNext->pNtk)[lVar19]->pName + 4);
                    lVar19 = lVar19 + 1;
                  } while ((int)uVar20 != lVar19);
                }
                iVar18 = *(int *)(*(long *)((long)pvVar5 + 0x28) + 4);
                uVar28 = *(int *)(*(long *)((long)pvVar5 + 0x30) + 4) + iVar18;
                if (uVar27 != uVar28) {
                  uVar10 = *(undefined8 *)((long)pvVar5 + 8);
                  pcVar12 = Abc_ObjName(pObj);
                  sprintf(pMan->sError,
                          "The number of actual IOs (%d) is different from the number of formal IOs (%d) when instantiating network %s in box %s."
                          ,(ulong)uVar20,(ulong)uVar28,uVar10,pcVar12);
                  if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                    lVar22 = 0;
                    do {
                      Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar22]);
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < *(int *)((long)&__ptr->pNtk + 4));
                  }
                  goto LAB_0084ebce;
                }
                uVar24 = 0;
                if (0 < iVar18) {
                  iVar18 = 0;
                  do {
                    if ((iVar18 < 0) || ((long)*(int *)((long)&__ptr->pNtk + 4) <= (long)uVar24))
                    goto LAB_0084ed1a;
                    pAVar29 = (&__ptr->pNext->pNtk)[uVar24];
                    iVar3 = *(int *)(pAVar29->pName + 4);
                    if (0 < (long)iVar3) {
                      iVar18 = iVar18 + iVar3;
                      lVar19 = (long)iVar3;
                      do {
                        pcVar12 = pAVar29->pName;
                        if (*(int *)(pcVar12 + 4) < lVar19) goto LAB_0084ed1a;
                        pAVar16 = *(Abc_Obj_t **)(*(long *)(pcVar12 + 8) + -8 + lVar19 * 8);
                        pAVar13 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_BI);
                        Abc_ObjAddFanin(pObj,pAVar13);
                        Abc_ObjAddFanin(pAVar13,pAVar16);
                        bVar30 = 1 < lVar19;
                        lVar19 = lVar19 + -1;
                      } while (bVar30);
                    }
                    uVar24 = uVar24 + 1;
                  } while (iVar18 < *(int *)(*(long *)((long)pvVar5 + 0x28) + 4));
                  uVar24 = uVar24 & 0xffffffff;
                }
                if (0 < *(int *)(*(long *)((long)pvVar5 + 0x30) + 4)) {
                  iVar18 = 0;
                  do {
                    if ((iVar18 < 0) || (*(int *)((long)&__ptr->pNtk + 4) <= (int)uVar24)) {
LAB_0084ed1a:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    pAVar29 = (&__ptr->pNext->pNtk)[uVar24];
                    iVar3 = *(int *)(pAVar29->pName + 4);
                    if (0 < (long)iVar3) {
                      iVar18 = iVar18 + iVar3;
                      lVar19 = (long)iVar3;
                      do {
                        pcVar12 = pAVar29->pName;
                        if (*(int *)(pcVar12 + 4) < lVar19) goto LAB_0084ed1a;
                        pAVar16 = *(Abc_Obj_t **)(*(long *)(pcVar12 + 8) + -8 + lVar19 * 8);
                        pAVar13 = Abc_NtkCreateObj(pAVar6,ABC_OBJ_BO);
                        Abc_ObjAddFanin(pAVar13,pObj);
                        Abc_ObjAddFanin(pAVar16,pAVar13);
                        bVar30 = 1 < lVar19;
                        lVar19 = lVar19 + -1;
                      } while (bVar30);
                    }
                    uVar24 = uVar24 + 1;
                  } while (iVar18 < *(int *)(*(long *)((long)pvVar5 + 0x30) + 4));
                }
                if (0 < *(int *)((long)&__ptr->pNtk + 4)) {
                  lVar19 = 0;
                  do {
                    Ver_ParseFreeBundle((Ver_Bundle_t *)(&__ptr->pNext->pNtk)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < *(int *)((long)&__ptr->pNtk + 4));
                }
              }
              if (__ptr->pNext != (Abc_Obj_t *)0x0) {
                free(__ptr->pNext);
                __ptr->pNext = (Abc_Obj_t *)0x0;
              }
              if (__ptr != (Abc_Obj_t *)0x0) {
                free(__ptr);
              }
              (pObj->field_6).pTemp = (void *)0x0;
              if (*(int *)((long)(pObj->field_5).pData + 4) != 6) {
                if ((*(uint *)&pObj->field_0x14 & 0xf) != 10) {
                  __assert_fail("Abc_ObjIsBlackbox(pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                                ,0x16b,"void Abc_ObjBlackboxToWhitebox(Abc_Obj_t *)");
                }
                *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfffffff0 | 9;
                pAVar6 = pObj->pNtk;
                piVar1 = pAVar6->nObjCounts + 10;
                *piVar1 = *piVar1 + -1;
                piVar1 = pAVar6->nObjCounts + 9;
                *piVar1 = *piVar1 + 1;
              }
            }
          }
          lVar26 = lVar26 + 1;
          lVar19 = *(long *)((long)pvVar4 + 0x50);
        } while (lVar26 < *(int *)(lVar19 + 4));
      }
      lVar22 = lVar22 + 1;
      pVVar11 = pMan->pDesign->vModules;
    } while (lVar22 < pVVar11->nSize);
  }
  return iVar25;
}

Assistant:

int Ver_ParseConnectDefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    // go through all the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        // go through all the boxes of this module
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            // skip internal boxes of the blackboxes
            if ( pBox->pData == NULL )
                continue;
            // if the network is undefined, it will be connected later
            if ( !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
            {
                RetValue = 2;
                continue;
            }
            // connect the box
            if ( !Ver_ParseConnectBox( pMan, pBox ) )
                return 0;
            // if the network is a true blackbox, skip
            if ( Abc_NtkHasBlackbox((Abc_Ntk_t *)pBox->pData) )
                continue;
            // convert the box to the whitebox
            Abc_ObjBlackboxToWhitebox( pBox );
        }
    }
    return RetValue;
}